

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int libssh2_userauth_publickey_frommemory
              (LIBSSH2_SESSION *session,char *user,size_t user_len,char *publickeyfiledata,
              size_t publickeyfiledata_len,char *privatekeyfiledata,size_t privatekeyfiledata_len,
              char *passphrase)

{
  int iVar1;
  time_t start_time;
  time_t entry_time;
  int rc;
  char *privatekeyfiledata_local;
  size_t publickeyfiledata_len_local;
  char *publickeyfiledata_local;
  size_t user_len_local;
  char *user_local;
  LIBSSH2_SESSION *session_local;
  
  if (passphrase == (char *)0x0) {
    passphrase = "";
  }
  start_time = time((time_t *)0x0);
  while( true ) {
    iVar1 = userauth_publickey_frommemory
                      (session,user,user_len,publickeyfiledata,publickeyfiledata_len,
                       privatekeyfiledata,privatekeyfiledata_len,passphrase);
    if (iVar1 != -0x25) {
      return iVar1;
    }
    if (session->api_block_mode == 0) break;
    iVar1 = _libssh2_wait_socket(session,start_time);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  return -0x25;
}

Assistant:

LIBSSH2_API int
libssh2_userauth_publickey_frommemory(LIBSSH2_SESSION *session,
                                      const char *user,
                                      size_t user_len,
                                      const char *publickeyfiledata,
                                      size_t publickeyfiledata_len,
                                      const char *privatekeyfiledata,
                                      size_t privatekeyfiledata_len,
                                      const char *passphrase)
{
    int rc;

    if(!passphrase)
        /* if given a NULL pointer, make it point to a zero-length
           string to save us from having to check this all over */
        passphrase = "";

    BLOCK_ADJUST(rc, session,
                 userauth_publickey_frommemory(session, user, user_len,
                                               publickeyfiledata,
                                               publickeyfiledata_len,
                                               privatekeyfiledata,
                                               privatekeyfiledata_len,
                                               passphrase));
    return rc;
}